

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_ack(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  uint8_t uVar1;
  quicly_ranges_t *ranges;
  ulong end_range_index;
  int iVar2;
  long lVar3;
  
  if (acked != 0) {
    uVar1 = packet->ack_epoch;
    if (uVar1 == '\0') {
      lVar3 = -0x100;
    }
    else if (uVar1 == '\x03') {
      lVar3 = -0xf0;
    }
    else {
      if (uVar1 != '\x02') {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x9dd,
                      "int on_ack_ack(quicly_sentmap_t *, const quicly_sent_packet_t *, int, quicly_sent_t *)"
                     );
      }
      lVar3 = -0xf8;
    }
    ranges = *(quicly_ranges_t **)((long)&map->head + lVar3);
    iVar2 = quicly_ranges_subtract
                      (ranges,(sent->data).packet.packet_number,(sent->data).ack.range.end);
    if (iVar2 != 0) {
      return iVar2;
    }
    end_range_index = ranges->num_ranges;
    if (end_range_index == 0) {
      ranges[1].ranges = (quicly_range_t *)0x7fffffffffffffff;
      *(undefined4 *)&ranges[1].capacity = 0;
    }
    else if (0x40 < end_range_index) {
      quicly_ranges_drop_by_range_indices(ranges,end_range_index - 0x40,end_range_index);
    }
  }
  return 0;
}

Assistant:

static int on_ack_ack(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    /* TODO log */

    if (acked) {
        /* find the pn space */
        struct st_quicly_pn_space_t *space;
        switch (packet->ack_epoch) {
        case QUICLY_EPOCH_INITIAL:
            space = &conn->initial->super;
            break;
        case QUICLY_EPOCH_HANDSHAKE:
            space = &conn->handshake->super;
            break;
        case QUICLY_EPOCH_1RTT:
            space = &conn->application->super;
            break;
        default:
            assert(!"FIXME");
            return QUICLY_TRANSPORT_ERROR_INTERNAL;
        }
        /* subtract given ACK range, then make adjustments */
        int ret;
        if ((ret = quicly_ranges_subtract(&space->ack_queue, sent->data.ack.range.start, sent->data.ack.range.end)) != 0)
            return ret;
        if (space->ack_queue.num_ranges == 0) {
            space->largest_pn_received_at = INT64_MAX;
            space->unacked_count = 0;
        } else if (space->ack_queue.num_ranges > QUICLY_MAX_ACK_BLOCKS) {
            quicly_ranges_drop_by_range_indices(&space->ack_queue, space->ack_queue.num_ranges - QUICLY_MAX_ACK_BLOCKS,
                                                space->ack_queue.num_ranges);
        }
    }

    return 0;
}